

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3EvalPhrasePoslist(Fts3Cursor *pCsr,Fts3Expr *pExpr,int iCol,char **ppOut)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  byte *local_b8;
  int local_ac;
  int local_a8;
  bool local_a2;
  bool local_a1;
  bool local_9f;
  int local_9c;
  ulong *puStack_98;
  int dummy;
  Fts3Phrase *pPh;
  Fts3Expr *pTest;
  uint local_80;
  int iStack_7c;
  u8 bEof;
  int bEofSave;
  int bMatch;
  Fts3Expr *pNear;
  Fts3Expr *p;
  uint uStack_60;
  u8 bTreeEof;
  int bOr;
  int bDescDoclist;
  int rc;
  sqlite3_int64 iDocid;
  byte *pbStack_48;
  int iThis;
  char *pIter;
  Fts3Table *pTab;
  Fts3Phrase *pPhrase;
  char **ppOut_local;
  Fts3Expr *pFStack_20;
  int iCol_local;
  Fts3Expr *pExpr_local;
  Fts3Cursor *pCsr_local;
  
  pTab = (Fts3Table *)pExpr->pPhrase;
  pIter = (char *)(pCsr->base).pVtab;
  *ppOut = (char *)0x0;
  if ((*(int *)((long)&pTab->zContentTbl + 4) <
       *(int *)&((sqlite3_vtab *)((long)pIter + 0x30))->pModule) &&
     (*(int *)((long)&pTab->zContentTbl + 4) != iCol)) {
    pCsr_local._4_4_ = 0;
  }
  else {
    _bDescDoclist = pExpr->iDocid;
    pbStack_48 = (byte *)pTab->zName;
    pPhrase = (Fts3Phrase *)ppOut;
    ppOut_local._4_4_ = iCol;
    pFStack_20 = pExpr;
    pExpr_local = (Fts3Expr *)pCsr;
    if ((_bDescDoclist == pCsr->iPrevId) && (pExpr->bEof == '\0')) {
LAB_0020c22f:
      if (pbStack_48 == (byte *)0x0) {
        pCsr_local._4_4_ = 0;
      }
      else {
        if (*pbStack_48 == 1) {
          pbStack_48 = pbStack_48 + 1;
          if ((*pbStack_48 & 0x80) == 0) {
            iDocid._4_4_ = (uint)*pbStack_48;
            local_a8 = 1;
          }
          else {
            local_a8 = sqlite3Fts3GetVarint32((char *)pbStack_48,(int *)((long)&iDocid + 4));
          }
          pbStack_48 = pbStack_48 + local_a8;
        }
        else {
          iDocid._4_4_ = 0;
        }
        while ((int)iDocid._4_4_ < (int)ppOut_local._4_4_) {
          fts3ColumnlistCopy((char **)0x0,(char **)&stack0xffffffffffffffb8);
          if (*pbStack_48 == 0) {
            return 0;
          }
          pbStack_48 = pbStack_48 + 1;
          if ((*pbStack_48 & 0x80) == 0) {
            iDocid._4_4_ = (uint)*pbStack_48;
            local_ac = 1;
          }
          else {
            local_ac = sqlite3Fts3GetVarint32((char *)pbStack_48,(int *)((long)&iDocid + 4));
          }
          pbStack_48 = pbStack_48 + local_ac;
        }
        if (*pbStack_48 == 0) {
          pbStack_48 = (byte *)0x0;
        }
        if (ppOut_local._4_4_ == iDocid._4_4_) {
          local_b8 = pbStack_48;
        }
        else {
          local_b8 = (byte *)0x0;
        }
        (pPhrase->doclist).aAll = (char *)local_b8;
        pCsr_local._4_4_ = 0;
      }
    }
    else {
      bOr = 0;
      uStack_60 = (uint)*(byte *)((long)&((sqlite3_vtab *)((long)pIter + 0x1b0))->zErrMsg + 7);
      p._4_4_ = 0;
      p._3_1_ = '\0';
      _bEofSave = pExpr;
      for (pNear = pExpr->pParent; pNear != (Fts3Expr *)0x0; pNear = pNear->pParent) {
        if (pNear->eType == 4) {
          p._4_4_ = 1;
        }
        if (pNear->eType == 1) {
          _bEofSave = pNear;
        }
        if (pNear->bEof != '\0') {
          p._3_1_ = '\x01';
        }
      }
      if (p._4_4_ == 0) {
        pCsr_local._4_4_ = 0;
      }
      else {
        if (*(int *)&pTab->azColumn != 0) {
          local_80 = (uint)_bEofSave->bEof;
          fts3EvalRestart(pCsr,_bEofSave,&bOr);
          do {
            bVar3 = false;
            if (bOr == 0) {
              bVar3 = _bEofSave->bEof == '\0';
            }
          } while ((bVar3) &&
                  ((fts3EvalNextRow((Fts3Cursor *)pExpr_local,_bEofSave,&bOr), local_80 != 0 ||
                   (_bEofSave->iDocid != _bDescDoclist))));
        }
        if (p._3_1_ != '\0') {
          while( true ) {
            bVar3 = false;
            if (bOr == 0) {
              bVar3 = _bEofSave->bEof == '\0';
            }
            if (!bVar3) break;
            fts3EvalNextRow((Fts3Cursor *)pExpr_local,_bEofSave,&bOr);
          }
        }
        if (bOr == 0) {
          iStack_7c = 1;
          pNear = _bEofSave;
LAB_0020bf8f:
          if (pNear != (Fts3Expr *)0x0) {
            pPh = (Fts3Phrase *)pNear;
            if (pNear->eType == 1) {
              pPh = (Fts3Phrase *)pNear->pRight;
            }
            puStack_98 = *(ulong **)&(pPh->doclist).bFreeList;
            pbStack_48 = (byte *)puStack_98[8];
            _bDescDoclist = puStack_98[9];
            if (*(byte *)((long)&pExpr_local[1].pParent + 4) != uStack_60) {
              local_a1 = true;
              if ((int)puStack_98[1] != 0) {
                local_a2 = false;
                if (pbStack_48 != (byte *)0x0) {
                  local_a2 = pbStack_48 <= (char *)*puStack_98;
                }
                local_a1 = local_a2;
              }
              pTest._7_1_ = local_a1;
              do {
                if (pbStack_48 == (byte *)0x0) {
LAB_0020c16c:
                  bVar3 = pTest._7_1_ == '\0';
                }
                else {
                  iVar2 = 1;
                  if (uStack_60 != 0) {
                    iVar2 = -1;
                  }
                  bVar3 = false;
                  if (0 < (long)((long)iVar2 * (_bDescDoclist - *(long *)&pExpr_local->bEof)))
                  goto LAB_0020c16c;
                }
                if (!bVar3) goto LAB_0020c1c2;
                sqlite3Fts3DoclistPrev
                          (uStack_60,(char *)*puStack_98,(int)puStack_98[1],
                           (char **)&stack0xffffffffffffffb8,(sqlite3_int64 *)&bDescDoclist,
                           &local_9c,(u8 *)((long)&pTest + 7));
              } while( true );
            }
            local_9f = true;
            if ((int)puStack_98[1] != 0) {
              local_9f = (char *)(*puStack_98 + (long)(int)puStack_98[1]) <= pbStack_48;
            }
            pTest._7_1_ = local_9f;
            do {
              if (pbStack_48 == (byte *)0x0) {
LAB_0020c08e:
                bVar3 = pTest._7_1_ == '\0';
              }
              else {
                iVar2 = 1;
                if (uStack_60 != 0) {
                  iVar2 = -1;
                }
                bVar3 = false;
                if ((long)((long)iVar2 * (_bDescDoclist - *(long *)&pExpr_local->bEof)) < 0)
                goto LAB_0020c08e;
              }
              if (!bVar3) goto LAB_0020c1c2;
              sqlite3Fts3DoclistNext
                        (uStack_60,(char *)*puStack_98,(int)puStack_98[1],
                         (char **)&stack0xffffffffffffffb8,(sqlite3_int64 *)&bDescDoclist,
                         (u8 *)((long)&pTest + 7));
            } while( true );
          }
          if (iStack_7c == 0) {
            pbStack_48 = (byte *)0x0;
          }
          else {
            pbStack_48 = pTab->abNotindexed;
          }
          goto LAB_0020c22f;
        }
        pCsr_local._4_4_ = bOr;
      }
    }
  }
  return pCsr_local._4_4_;
LAB_0020c1c2:
  puStack_98[8] = (ulong)pbStack_48;
  puStack_98[9] = _bDescDoclist;
  if ((pTest._7_1_ != '\0') ||
     (uVar1._0_1_ = pExpr_local->bEof, uVar1._1_1_ = pExpr_local->bStart,
     uVar1._2_1_ = pExpr_local->bDeferred, uVar1._3_1_ = pExpr_local->field_0x33,
     uVar1._4_4_ = pExpr_local->iPhrase, _bDescDoclist != uVar1)) {
    iStack_7c = 0;
  }
  pNear = pNear->pLeft;
  goto LAB_0020bf8f;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3EvalPhrasePoslist(
  Fts3Cursor *pCsr,               /* FTS3 cursor object */
  Fts3Expr *pExpr,                /* Phrase to return doclist for */
  int iCol,                       /* Column to return position list for */
  char **ppOut                    /* OUT: Pointer to position list */
){
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  char *pIter;
  int iThis;
  sqlite3_int64 iDocid;

  /* If this phrase is applies specifically to some column other than 
  ** column iCol, return a NULL pointer.  */
  *ppOut = 0;
  assert( iCol>=0 && iCol<pTab->nColumn );
  if( (pPhrase->iColumn<pTab->nColumn && pPhrase->iColumn!=iCol) ){
    return SQLITE_OK;
  }

  iDocid = pExpr->iDocid;
  pIter = pPhrase->doclist.pList;
  if( iDocid!=pCsr->iPrevId || pExpr->bEof ){
    int rc = SQLITE_OK;
    int bDescDoclist = pTab->bDescIdx;      /* For DOCID_CMP macro */
    int bOr = 0;
    u8 bTreeEof = 0;
    Fts3Expr *p;                  /* Used to iterate from pExpr to root */
    Fts3Expr *pNear;              /* Most senior NEAR ancestor (or pExpr) */
    int bMatch;

    /* Check if this phrase descends from an OR expression node. If not, 
    ** return NULL. Otherwise, the entry that corresponds to docid 
    ** pCsr->iPrevId may lie earlier in the doclist buffer. Or, if the
    ** tree that the node is part of has been marked as EOF, but the node
    ** itself is not EOF, then it may point to an earlier entry. */
    pNear = pExpr;
    for(p=pExpr->pParent; p; p=p->pParent){
      if( p->eType==FTSQUERY_OR ) bOr = 1;
      if( p->eType==FTSQUERY_NEAR ) pNear = p;
      if( p->bEof ) bTreeEof = 1;
    }
    if( bOr==0 ) return SQLITE_OK;

    /* This is the descendent of an OR node. In this case we cannot use
    ** an incremental phrase. Load the entire doclist for the phrase
    ** into memory in this case.  */
    if( pPhrase->bIncr ){
      int bEofSave = pNear->bEof;
      fts3EvalRestart(pCsr, pNear, &rc);
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
        if( bEofSave==0 && pNear->iDocid==iDocid ) break;
      }
      assert( rc!=SQLITE_OK || pPhrase->bIncr==0 );
    }
    if( bTreeEof ){
      while( rc==SQLITE_OK && !pNear->bEof ){
        fts3EvalNextRow(pCsr, pNear, &rc);
      }
    }
    if( rc!=SQLITE_OK ) return rc;

    bMatch = 1;
    for(p=pNear; p; p=p->pLeft){
      u8 bEof = 0;
      Fts3Expr *pTest = p;
      Fts3Phrase *pPh;
      assert( pTest->eType==FTSQUERY_NEAR || pTest->eType==FTSQUERY_PHRASE );
      if( pTest->eType==FTSQUERY_NEAR ) pTest = pTest->pRight;
      assert( pTest->eType==FTSQUERY_PHRASE );
      pPh = pTest->pPhrase;

      pIter = pPh->pOrPoslist;
      iDocid = pPh->iOrDocid;
      if( pCsr->bDesc==bDescDoclist ){
        bEof = !pPh->doclist.nAll ||
          (pIter >= (pPh->doclist.aAll + pPh->doclist.nAll));
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)<0 ) && bEof==0 ){
          sqlite3Fts3DoclistNext(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &bEof
          );
        }
      }else{
        bEof = !pPh->doclist.nAll || (pIter && pIter<=pPh->doclist.aAll);
        while( (pIter==0 || DOCID_CMP(iDocid, pCsr->iPrevId)>0 ) && bEof==0 ){
          int dummy;
          sqlite3Fts3DoclistPrev(
              bDescDoclist, pPh->doclist.aAll, pPh->doclist.nAll, 
              &pIter, &iDocid, &dummy, &bEof
              );
        }
      }
      pPh->pOrPoslist = pIter;
      pPh->iOrDocid = iDocid;
      if( bEof || iDocid!=pCsr->iPrevId ) bMatch = 0;
    }

    if( bMatch ){
      pIter = pPhrase->pOrPoslist;
    }else{
      pIter = 0;
    }
  }
  if( pIter==0 ) return SQLITE_OK;

  if( *pIter==0x01 ){
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }else{
    iThis = 0;
  }
  while( iThis<iCol ){
    fts3ColumnlistCopy(0, &pIter);
    if( *pIter==0x00 ) return SQLITE_OK;
    pIter++;
    pIter += fts3GetVarint32(pIter, &iThis);
  }
  if( *pIter==0x00 ){
    pIter = 0;
  }

  *ppOut = ((iCol==iThis)?pIter:0);
  return SQLITE_OK;
}